

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O2

void __thiscall
btGeneric6DofSpring2Constraint::setAxis
          (btGeneric6DofSpring2Constraint *this,btVector3 *axis1,btVector3 *axis2)

{
  btVector3 bVar1;
  btVector3 yAxis;
  btVector3 zAxis;
  btVector3 local_100;
  btVector3 local_f0;
  btTransform local_e0;
  btTransform local_a0;
  btTransform local_60;
  
  local_f0 = btVector3::normalized(axis1);
  local_100 = btVector3::normalized(axis2);
  bVar1 = btVector3::cross(&local_100,&local_f0);
  local_60.m_basis.m_el[0].m_floats[0] = bVar1.m_floats[0];
  local_60.m_basis.m_el[1].m_floats[0] = bVar1.m_floats[1];
  local_60.m_origin.m_floats[0] = 0.0;
  local_60.m_origin.m_floats[1] = 0.0;
  local_60.m_origin.m_floats[2] = 0.0;
  local_60.m_origin.m_floats[3] = 0.0;
  local_60.m_basis.m_el[0].m_floats[1] = local_100.m_floats[0];
  local_60.m_basis.m_el[0].m_floats[2] = local_f0.m_floats[0];
  local_60.m_basis.m_el[0].m_floats[3] = 0.0;
  local_60.m_basis.m_el[1].m_floats[1] = local_100.m_floats[1];
  local_60.m_basis.m_el[1].m_floats[2] = local_f0.m_floats[1];
  local_60.m_basis.m_el[1].m_floats[3] = 0.0;
  local_60.m_basis.m_el[2].m_floats[0] = bVar1.m_floats[2];
  local_60.m_basis.m_el[2].m_floats[1] = local_100.m_floats[2];
  local_60.m_basis.m_el[2].m_floats[2] = local_f0.m_floats[2];
  local_60.m_basis.m_el[2].m_floats[3] = 0.0;
  btTransform::inverse
            (&local_e0,
             &(((this->super_btTypedConstraint).m_rbA)->super_btCollisionObject).m_worldTransform);
  btTransform::operator*(&local_a0,&local_e0,&local_60);
  *(undefined8 *)(this->m_frameInA).m_basis.m_el[0].m_floats =
       local_a0.m_basis.m_el[0].m_floats._0_8_;
  *(undefined8 *)((this->m_frameInA).m_basis.m_el[0].m_floats + 2) =
       local_a0.m_basis.m_el[0].m_floats._8_8_;
  *(undefined8 *)(this->m_frameInA).m_basis.m_el[1].m_floats =
       local_a0.m_basis.m_el[1].m_floats._0_8_;
  *(undefined8 *)((this->m_frameInA).m_basis.m_el[1].m_floats + 2) =
       local_a0.m_basis.m_el[1].m_floats._8_8_;
  *(undefined8 *)(this->m_frameInA).m_basis.m_el[2].m_floats =
       local_a0.m_basis.m_el[2].m_floats._0_8_;
  *(undefined8 *)((this->m_frameInA).m_basis.m_el[2].m_floats + 2) =
       local_a0.m_basis.m_el[2].m_floats._8_8_;
  *(undefined8 *)(this->m_frameInA).m_origin.m_floats = local_a0.m_origin.m_floats._0_8_;
  *(undefined8 *)((this->m_frameInA).m_origin.m_floats + 2) = local_a0.m_origin.m_floats._8_8_;
  btTransform::inverse
            (&local_e0,
             &(((this->super_btTypedConstraint).m_rbB)->super_btCollisionObject).m_worldTransform);
  btTransform::operator*(&local_a0,&local_e0,&local_60);
  *(undefined8 *)(this->m_frameInB).m_basis.m_el[0].m_floats =
       local_a0.m_basis.m_el[0].m_floats._0_8_;
  *(undefined8 *)((this->m_frameInB).m_basis.m_el[0].m_floats + 2) =
       local_a0.m_basis.m_el[0].m_floats._8_8_;
  *(undefined8 *)(this->m_frameInB).m_basis.m_el[1].m_floats =
       local_a0.m_basis.m_el[1].m_floats._0_8_;
  *(undefined8 *)((this->m_frameInB).m_basis.m_el[1].m_floats + 2) =
       local_a0.m_basis.m_el[1].m_floats._8_8_;
  *(undefined8 *)(this->m_frameInB).m_basis.m_el[2].m_floats =
       local_a0.m_basis.m_el[2].m_floats._0_8_;
  *(undefined8 *)((this->m_frameInB).m_basis.m_el[2].m_floats + 2) =
       local_a0.m_basis.m_el[2].m_floats._8_8_;
  *(undefined8 *)(this->m_frameInB).m_origin.m_floats = local_a0.m_origin.m_floats._0_8_;
  *(undefined8 *)((this->m_frameInB).m_origin.m_floats + 2) = local_a0.m_origin.m_floats._8_8_;
  calculateTransforms(this);
  return;
}

Assistant:

void btGeneric6DofSpring2Constraint::setAxis(const btVector3& axis1,const btVector3& axis2)
{
	btVector3 zAxis = axis1.normalized();
	btVector3 yAxis = axis2.normalized();
	btVector3 xAxis = yAxis.cross(zAxis); // we want right coordinate system
	
	btTransform frameInW;
	frameInW.setIdentity();
	frameInW.getBasis().setValue( xAxis[0], yAxis[0], zAxis[0],
	                              xAxis[1], yAxis[1], zAxis[1],
	                              xAxis[2], yAxis[2], zAxis[2]);
	
	// now get constraint frame in local coordinate systems
	m_frameInA = m_rbA.getCenterOfMassTransform().inverse() * frameInW;
	m_frameInB = m_rbB.getCenterOfMassTransform().inverse() * frameInW;
	
	calculateTransforms();
}